

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ImVector<ImFontGlyph> *this_00;
  ImVector<unsigned_short> *this_01;
  ushort uVar1;
  undefined2 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImFontGlyph *pIVar9;
  float *pfVar10;
  unsigned_short *puVar11;
  ImFontGlyph *pIVar12;
  uint uVar13;
  int i_1;
  int iVar14;
  int i;
  uint i_00;
  float fVar15;
  
  this_00 = &this->Glyphs;
  uVar13 = 0;
  for (i_00 = 0; i_00 != this_00->Size; i_00 = i_00 + 1) {
    pIVar9 = ImVector<ImFontGlyph>::operator[](this_00,i_00);
    if (uVar13 <= pIVar9->Codepoint) {
      uVar13 = (uint)pIVar9->Codepoint;
    }
  }
  if (i_00 < 0xffff) {
    ImVector<float>::clear(&this->IndexAdvanceX);
    this_01 = &this->IndexLookup;
    ImVector<unsigned_short>::clear(this_01);
    this->DirtyLookupTables = false;
    GrowIndex(this,uVar13 + 1);
    for (iVar14 = 0; iVar14 < this_00->Size; iVar14 = iVar14 + 1) {
      pIVar9 = ImVector<ImFontGlyph>::operator[](this_00,iVar14);
      uVar1 = pIVar9->Codepoint;
      pIVar9 = ImVector<ImFontGlyph>::operator[](this_00,iVar14);
      fVar15 = pIVar9->AdvanceX;
      pfVar10 = ImVector<float>::operator[](&this->IndexAdvanceX,(uint)uVar1);
      *pfVar10 = fVar15;
      puVar11 = ImVector<unsigned_short>::operator[](this_01,(uint)uVar1);
      *puVar11 = (unsigned_short)iVar14;
    }
    pIVar9 = FindGlyph(this,0x20);
    if (pIVar9 != (ImFontGlyph *)0x0) {
      pIVar9 = ImVector<ImFontGlyph>::back(this_00);
      if (pIVar9->Codepoint != 9) {
        ImVector<ImFontGlyph>::resize(this_00,this_00->Size + 1);
      }
      pIVar9 = ImVector<ImFontGlyph>::back(this_00);
      pIVar12 = FindGlyph(this,0x20);
      uVar2 = *(undefined2 *)&pIVar12->field_0x2;
      fVar15 = pIVar12->AdvanceX;
      fVar3 = pIVar12->X0;
      fVar4 = pIVar12->Y0;
      fVar5 = pIVar12->X1;
      fVar6 = pIVar12->Y1;
      fVar7 = pIVar12->U0;
      fVar8 = pIVar12->V0;
      pIVar9->Codepoint = pIVar12->Codepoint;
      *(undefined2 *)&pIVar9->field_0x2 = uVar2;
      pIVar9->AdvanceX = fVar15;
      pIVar9->X0 = fVar3;
      pIVar9->Y0 = fVar4;
      pIVar9->X1 = fVar5;
      pIVar9->Y1 = fVar6;
      pIVar9->U0 = fVar7;
      pIVar9->V0 = fVar8;
      fVar15 = pIVar12->V1;
      pIVar9->U1 = pIVar12->U1;
      pIVar9->V1 = fVar15;
      pIVar9->Codepoint = 9;
      fVar15 = pIVar9->AdvanceX * 4.0;
      pIVar9->AdvanceX = fVar15;
      pfVar10 = ImVector<float>::operator[](&this->IndexAdvanceX,9);
      *pfVar10 = fVar15;
      iVar14 = (this->Glyphs).Size;
      puVar11 = ImVector<unsigned_short>::operator[](this_01,(uint)pIVar9->Codepoint);
      *puVar11 = (short)iVar14 - 1;
    }
    pIVar9 = FindGlyphNoFallback(this,this->FallbackChar);
    this->FallbackGlyph = pIVar9;
    fVar15 = 0.0;
    if (pIVar9 != (ImFontGlyph *)0x0) {
      fVar15 = pIVar9->AdvanceX;
    }
    this->FallbackAdvanceX = fVar15;
    for (iVar14 = 0; uVar13 + 1 != iVar14; iVar14 = iVar14 + 1) {
      pfVar10 = ImVector<float>::operator[](&this->IndexAdvanceX,iVar14);
      if (*pfVar10 <= 0.0 && *pfVar10 != 0.0) {
        fVar15 = this->FallbackAdvanceX;
        pfVar10 = ImVector<float>::operator[](&this->IndexAdvanceX,iVar14);
        *pfVar10 = fVar15;
      }
    }
    return;
  }
  __assert_fail("Glyphs.Size < 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_draw.cpp"
                ,0x9c8,"void ImFont::BuildLookupTable()");
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size-1);
    }

    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}